

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_YIELD(DisasContext_conflict1 *s,arg_YIELD *a)

{
  TranslationBlock *extraout_RAX;
  TranslationBlock *pTVar1;
  
  pTVar1 = (s->base).tb;
  if ((pTVar1->cflags & 0x80000) == 0) {
    gen_set_pc_im(s,(s->base).pc_next);
    (s->base).is_jmp = DISAS_TARGET_7;
    pTVar1 = extraout_RAX;
  }
  return SUB81(pTVar1,0);
}

Assistant:

static bool trans_YIELD(DisasContext *s, arg_YIELD *a)
{
    /*
     * When running single-threaded TCG code, use the helper to ensure that
     * the next round-robin scheduled vCPU gets a crack.  When running in
     * MTTCG we don't generate jumps to the helper as it won't affect the
     * scheduling of other vCPUs.
     */
    if (!(tb_cflags(s->base.tb) & CF_PARALLEL)) {
        gen_set_pc_im(s, s->base.pc_next);
        s->base.is_jmp = DISAS_YIELD;
    }
    return true;
}